

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_convert.cpp
# Opt level: O0

void __thiscall BadDataException::~BadDataException(BadDataException *this)

{
  BadDataException *in_RDI;
  
  ~BadDataException(in_RDI);
  operator_delete(in_RDI);
  return;
}

Assistant:

BadDataException(const std::string& message)
        : m_errorString(message)
    {}